

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory_basketball_factory.cpp
# Opt level: O0

shared_ptr<factory::Product> __thiscall
factory::BasketballFactory::GetProduct(BasketballFactory *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<factory::Product> sVar1;
  shared_ptr<factory::Basketball> local_28;
  BasketballFactory *this_local;
  
  this_local = this;
  std::make_shared<factory::Basketball>();
  std::shared_ptr<factory::Product>::shared_ptr<factory::Basketball,void>
            ((shared_ptr<factory::Product> *)this,&local_28);
  std::shared_ptr<factory::Basketball>::~shared_ptr(&local_28);
  sVar1.super___shared_ptr<factory::Product,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<factory::Product,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<factory::Product>)
         sVar1.super___shared_ptr<factory::Product,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Product> BasketballFactory::GetProduct() {
    return std::shared_ptr<Product>{std::make_shared<Basketball>()};
}